

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::CreateProgram
          (ShaderStorageBufferObjectBase *this,string *vs,string *tcs,string *tes,string *gs,
          string *fs)

{
  string *psVar1;
  GLuint program;
  GLuint GVar2;
  CallLogWrapper *this_00;
  char *src [2];
  char *local_58;
  pointer local_50;
  string *local_40;
  string *local_38;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  local_38 = tes;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (vs->_M_string_length != 0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    local_40 = gs;
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    local_58 = "#version 430 core\n";
    local_50 = (vs->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,2,&local_58,(GLint *)0x0);
    gs = local_40;
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  }
  if (tcs->_M_string_length != 0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e88);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    local_58 = "#version 430 core\n";
    local_50 = (tcs->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,2,&local_58,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  }
  psVar1 = local_38;
  if (local_38->_M_string_length != 0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e87);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    local_58 = "#version 430 core\n";
    local_50 = (psVar1->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,2,&local_58,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  }
  if (gs->_M_string_length != 0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8dd9);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    local_58 = "#version 430 core\n";
    local_50 = (gs->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,2,&local_58,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  }
  if (fs->_M_string_length != 0) {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    local_58 = "#version 430 core\n";
    local_50 = (fs->_M_dataplus)._M_p;
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,2,&local_58,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  }
  return program;
}

Assistant:

GLuint CreateProgram(const std::string& vs, const std::string& tcs, const std::string& tes, const std::string& gs,
						 const std::string& fs)
	{
		const GLuint p = glCreateProgram();
		if (!vs.empty())
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, vs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		if (!tcs.empty())
		{
			const GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, tcs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		if (!tes.empty())
		{
			const GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, tes.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		if (!gs.empty())
		{
			const GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, gs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		if (!fs.empty())
		{
			const GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			const char* const src[2] = { kGLSLVer, fs.c_str() };
			glShaderSource(sh, 2, src, NULL);
			glCompileShader(sh);
		}
		return p;
	}